

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardWriterPageState<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::
StandardWriterPageState
          (StandardWriterPageState<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          idx_t total_value_count,idx_t total_string_size,type encoding_p,
          PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *dictionary_p
          )

{
  byte bVar1;
  
  (this->super_ColumnWriterPageState)._vptr_ColumnWriterPageState =
       (_func_int **)&PTR__StandardWriterPageState_004d93c0;
  this->encoding = encoding_p;
  this->dbp_initialized = false;
  (this->dbp_encoder).total_value_count = total_value_count;
  (this->dbp_encoder).count = 0;
  this->dlba_initialized = false;
  DlbaEncoder::DlbaEncoder(&this->dlba_encoder,total_value_count,total_string_size);
  this->bss_initialized = false;
  BssEncoder::BssEncoder(&this->bss_encoder,total_value_count,4);
  this->dictionary = dictionary_p;
  this->dict_written_value = false;
  bVar1 = RleBpDecoder::ComputeBitWidth(dictionary_p->size);
  this->dict_bit_width = (uint)bVar1;
  (this->dict_encoder).bit_width = (uint)bVar1;
  (this->dict_encoder).byte_width = bVar1 + 7 >> 3;
  memset((this->dict_encoder).bp_block,0,0x800);
  return;
}

Assistant:

explicit StandardWriterPageState(const idx_t total_value_count, const idx_t total_string_size,
	                                 duckdb_parquet::Encoding::type encoding_p,
	                                 const PrimitiveDictionary<SRC, TGT, OP> &dictionary_p)
	    : encoding(encoding_p), dbp_initialized(false), dbp_encoder(total_value_count), dlba_initialized(false),
	      dlba_encoder(total_value_count, total_string_size), bss_initialized(false),
	      bss_encoder(total_value_count, sizeof(TGT)), dictionary(dictionary_p), dict_written_value(false),
	      dict_bit_width(RleBpDecoder::ComputeBitWidth(dictionary.GetSize())), dict_encoder(dict_bit_width) {
	}